

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O2

char * __thiscall
CoreML::Specification::BayesianProbitRegressor::_InternalParse
          (BayesianProbitRegressor *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  bool bVar1;
  uint32_t uVar2;
  string *s;
  BayesianProbitRegressor_FeatureWeight *msg;
  BayesianProbitRegressor_Gaussian *msg_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  char cVar3;
  uint32_t tag;
  char *local_48;
  uint local_3c;
  InternalMetadata *local_38;
  
  local_38 = &(this->super_MessageLite)._internal_metadata_;
  local_48 = ptr;
LAB_0028af12:
  do {
    bVar1 = google::protobuf::internal::ParseContext::Done(ctx,&local_48);
    if (bVar1) {
      return local_48;
    }
    local_48 = google::protobuf::internal::ReadTag(local_48,&local_3c,0);
    tag_00 = local_3c;
    cVar3 = (char)local_3c;
    switch(local_3c >> 3) {
    case 1:
      if (cVar3 != '\b') break;
      uVar2 = google::protobuf::internal::ReadVarint32(&local_48);
      this->numberoffeatures_ = uVar2;
      goto joined_r0x0028b0e3;
    case 2:
      if (cVar3 == '\x12') {
        msg_00 = _internal_mutable_bias(this);
        local_48 = google::protobuf::internal::ParseContext::ParseMessage
                             (ctx,&msg_00->super_MessageLite,local_48);
        goto joined_r0x0028b0e3;
      }
      break;
    case 3:
      if (cVar3 == '\x1a') {
        local_48 = local_48 + -1;
        do {
          local_48 = local_48 + 1;
          msg = google::protobuf::
                RepeatedPtrField<CoreML::Specification::BayesianProbitRegressor_FeatureWeight>::Add
                          (&this->features_);
          local_48 = google::protobuf::internal::ParseContext::ParseMessage
                               (ctx,&msg->super_MessageLite,local_48);
          if (local_48 == (char *)0x0) {
            return (char *)0x0;
          }
        } while ((local_48 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_48 == '\x1a'));
        goto LAB_0028af12;
      }
      break;
    case 10:
      if (cVar3 == 'R') {
        s = _internal_mutable_regressioninputfeaturename_abi_cxx11_(this);
LAB_0028b07f:
        local_48 = google::protobuf::internal::InlineGreedyStringParser(s,local_48,ctx);
        bVar1 = google::protobuf::internal::VerifyUTF8(s,(char *)0x0);
        if (!bVar1) {
          return (char *)0x0;
        }
        goto joined_r0x0028b0e3;
      }
      break;
    case 0xb:
      if (cVar3 == 'Z') {
        s = _internal_mutable_optimisminputfeaturename_abi_cxx11_(this);
        goto LAB_0028b07f;
      }
      break;
    case 0xc:
      if (cVar3 == 'b') {
        s = _internal_mutable_samplingscaleinputfeaturename_abi_cxx11_(this);
        goto LAB_0028b07f;
      }
      break;
    case 0xd:
      if (cVar3 == 'j') {
        s = _internal_mutable_samplingtruncationinputfeaturename_abi_cxx11_(this);
        goto LAB_0028b07f;
      }
      break;
    case 0x14:
      if (cVar3 == -0x5e) {
        s = _internal_mutable_meanoutputfeaturename_abi_cxx11_(this);
        goto LAB_0028b07f;
      }
      break;
    case 0x15:
      if (cVar3 == -0x56) {
        s = _internal_mutable_varianceoutputfeaturename_abi_cxx11_(this);
        goto LAB_0028b07f;
      }
      break;
    case 0x16:
      if (cVar3 == -0x4e) {
        s = _internal_mutable_pessimisticprobabilityoutputfeaturename_abi_cxx11_(this);
        goto LAB_0028b07f;
      }
      break;
    case 0x17:
      if (cVar3 == -0x46) {
        s = _internal_mutable_sampledprobabilityoutputfeaturename_abi_cxx11_(this);
        goto LAB_0028b07f;
      }
    }
    if ((local_3c == 0) || ((local_3c & 7) == 4)) {
      if (local_48 == (char *)0x0) {
        return (char *)0x0;
      }
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_3c - 1;
      return local_48;
    }
    unknown = google::protobuf::internal::InternalMetadata::
              mutable_unknown_fields<std::__cxx11::string>(local_38);
    local_48 = google::protobuf::internal::UnknownFieldParse(tag_00,unknown,local_48,ctx);
joined_r0x0028b0e3:
    if (local_48 == (char *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* BayesianProbitRegressor::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // uint32 numberOfFeatures = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 8)) {
          numberoffeatures_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.BayesianProbitRegressor.Gaussian bias = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 18)) {
          ptr = ctx->ParseMessage(_internal_mutable_bias(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // repeated .CoreML.Specification.BayesianProbitRegressor.FeatureWeight features = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 26)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_features(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<26>(ptr));
        } else
          goto handle_unusual;
        continue;
      // string regressionInputFeatureName = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 82)) {
          auto str = _internal_mutable_regressioninputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string optimismInputFeatureName = 11;
      case 11:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 90)) {
          auto str = _internal_mutable_optimisminputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string samplingScaleInputFeatureName = 12;
      case 12:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 98)) {
          auto str = _internal_mutable_samplingscaleinputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string samplingTruncationInputFeatureName = 13;
      case 13:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 106)) {
          auto str = _internal_mutable_samplingtruncationinputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string meanOutputFeatureName = 20;
      case 20:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 162)) {
          auto str = _internal_mutable_meanoutputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string varianceOutputFeatureName = 21;
      case 21:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 170)) {
          auto str = _internal_mutable_varianceoutputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string pessimisticProbabilityOutputFeatureName = 22;
      case 22:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 178)) {
          auto str = _internal_mutable_pessimisticprobabilityoutputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string sampledProbabilityOutputFeatureName = 23;
      case 23:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 186)) {
          auto str = _internal_mutable_sampledprobabilityoutputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}